

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O2

void __thiscall
simple_json::Stream::statement_no_return<std::__cxx11::string>
          (Stream *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts)

{
  statement_indent(this);
  spirv_cross::StringStream<4096UL,_4096UL>::operator<<(&this->buffer,ts);
  return;
}

Assistant:

void statement_no_return(Ts &&... ts)
	{
		statement_indent();
		statement_inner(std::forward<Ts>(ts)...);
	}